

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<Qt::DayOfWeek>::data(QList<Qt::DayOfWeek> *this)

{
  QArrayDataPointer<Qt::DayOfWeek> *this_00;
  DayOfWeek *pDVar1;
  QArrayDataPointer<Qt::DayOfWeek> *in_RDI;
  
  detach((QList<Qt::DayOfWeek> *)0x4f2ebc);
  this_00 = (QArrayDataPointer<Qt::DayOfWeek> *)QArrayDataPointer<Qt::DayOfWeek>::operator->(in_RDI)
  ;
  pDVar1 = QArrayDataPointer<Qt::DayOfWeek>::data(this_00);
  return pDVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }